

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

bool __thiscall
slang::ast::InstanceBodySymbol::hasSameType(InstanceBodySymbol *this,InstanceBodySymbol *other)

{
  bool bVar1;
  SymbolKind SVar2;
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_00;
  Type *rhs_00;
  pointer ppPVar3;
  ParameterSymbol *this_01;
  pointer ppPVar4;
  ParameterSymbol *this_02;
  bool bVar5;
  
  if (other == this) {
    bVar5 = true;
  }
  else if ((this->definition == other->definition) &&
          ((this->parameters)._M_extent._M_extent_value ==
           (other->parameters)._M_extent._M_extent_value)) {
    bVar5 = (this->parameters)._M_extent._M_extent_value == 0;
    if (!bVar5) {
      ppPVar4 = (other->parameters)._M_ptr;
      ppPVar3 = (this->parameters)._M_ptr;
      this_01 = (ParameterSymbol *)(*ppPVar3)->symbol;
      this_02 = (ParameterSymbol *)(*ppPVar4)->symbol;
      SVar2 = (this_01->super_ValueSymbol).super_Symbol.kind;
      if (SVar2 == (this_02->super_ValueSymbol).super_Symbol.kind) {
        do {
          ppPVar4 = ppPVar4 + 1;
          ppPVar3 = ppPVar3 + 1;
          if (SVar2 == Parameter) {
            lhs = ParameterSymbol::getValue(this_01,(SourceRange)ZEXT816(0));
            rhs = ParameterSymbol::getValue(this_02,(SourceRange)ZEXT816(0));
            bVar1 = slang::operator==(lhs,rhs);
          }
          else {
            this_00 = DeclaredType::getType
                                ((DeclaredType *)
                                 &(this_01->super_ValueSymbol).declaredType.dimensions);
            rhs_00 = DeclaredType::getType
                               ((DeclaredType *)
                                &(this_02->super_ValueSymbol).declaredType.dimensions);
            bVar1 = Type::isMatching(this_00,rhs_00);
          }
          if (bVar1 == false) {
            return bVar5;
          }
          bVar5 = ppPVar3 ==
                  (this->parameters)._M_ptr + (this->parameters)._M_extent._M_extent_value;
          if (bVar5) {
            return bVar5;
          }
          this_01 = (ParameterSymbol *)(*ppPVar3)->symbol;
          this_02 = (ParameterSymbol *)(*ppPVar4)->symbol;
          SVar2 = (this_01->super_ValueSymbol).super_Symbol.kind;
        } while (SVar2 == (this_02->super_ValueSymbol).super_Symbol.kind);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool InstanceBodySymbol::hasSameType(const InstanceBodySymbol& other) const {
    if (&other == this)
        return true;

    if (&definition != &other.definition)
        return false;

    if (parameters.size() != other.parameters.size())
        return false;

    for (auto li = parameters.begin(), ri = other.parameters.begin(); li != parameters.end();
         li++, ri++) {

        auto& lp = (*li)->symbol;
        auto& rp = (*ri)->symbol;
        if (lp.kind != rp.kind)
            return false;

        if (lp.kind == SymbolKind::Parameter) {
            auto& lv = lp.as<ParameterSymbol>().getValue();
            auto& rv = rp.as<ParameterSymbol>().getValue();
            if (lv != rv)
                return false;
        }
        else {
            auto& lt = lp.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    return true;
}